

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_log_module.c
# Opt level: O0

size_t ngx_stream_log_variable_getlen(ngx_stream_session_t *s,uintptr_t data)

{
  ngx_stream_variable_value_t *pnVar1;
  uintptr_t uVar2;
  ngx_stream_variable_value_t *value;
  uintptr_t len;
  uintptr_t data_local;
  ngx_stream_session_t *s_local;
  
  pnVar1 = ngx_stream_get_indexed_variable(s,data);
  if ((pnVar1 == (ngx_stream_variable_value_t *)0x0) || ((*(uint *)pnVar1 >> 0x1e & 1) != 0)) {
    s_local = (ngx_stream_session_t *)&DAT_00000001;
  }
  else {
    uVar2 = ngx_stream_log_escape((u_char *)0x0,pnVar1->data,(ulong)(*(uint *)pnVar1 & 0xfffffff));
    *(uint *)pnVar1 = *(uint *)pnVar1 & 0x7fffffff | (uint)(uVar2 != 0) << 0x1f;
    s_local = (ngx_stream_session_t *)((ulong)(*(uint *)pnVar1 & 0xfffffff) + uVar2 * 3);
  }
  return (size_t)s_local;
}

Assistant:

static size_t
ngx_stream_log_variable_getlen(ngx_stream_session_t *s, uintptr_t data)
{
    uintptr_t                     len;
    ngx_stream_variable_value_t  *value;

    value = ngx_stream_get_indexed_variable(s, data);

    if (value == NULL || value->not_found) {
        return 1;
    }

    len = ngx_stream_log_escape(NULL, value->data, value->len);

    value->escape = len ? 1 : 0;

    return value->len + len * 3;
}